

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O3

void __thiscall
ft::deque<int,_ft::allocator<int>_>::dequeInit(deque<int,_ft::allocator<int>_> *this,size_type n)

{
  void *pvVar1;
  size_type sVar2;
  map_pointer ppiVar3;
  pointer piVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar6 = n >> 6;
  uVar5 = 5;
  if (5 < uVar6) {
    uVar5 = uVar6;
  }
  this->m_chunks = uVar6 + 1;
  this->m_map_size = uVar5 + 3;
  ppiVar3 = (map_pointer)operator_new(uVar5 * 8 + 0x18);
  this->m_map = ppiVar3;
  uVar5 = this->m_map_size;
  if (uVar5 == 0) {
    uVar5 = 0x7fffffffffffffff;
  }
  else {
    sVar2 = this->m_chunks;
    pvVar1 = (void *)((long)ppiVar3 + (uVar5 - sVar2 & 0xfffffffffffffffe) * 4);
    lVar7 = 0;
    uVar6 = 0;
    do {
      ppiVar3 = this->m_map;
      if ((void *)((long)pvVar1 + sVar2 * 8 + -8) < (void *)((long)ppiVar3 + lVar7) ||
          (void *)((long)ppiVar3 + lVar7) < pvVar1) {
        piVar4 = (pointer)0x0;
      }
      else {
        piVar4 = (pointer)operator_new(0x100);
        ppiVar3 = this->m_map;
        uVar5 = this->m_map_size;
      }
      ppiVar3[uVar6] = piVar4;
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 8;
    } while (uVar6 < uVar5);
    ppiVar3 = this->m_map;
    uVar5 = uVar5 - 1 >> 1;
  }
  ppiVar3 = ppiVar3 + uVar5;
  (this->m_start).m_node = ppiVar3;
  piVar4 = *ppiVar3;
  (this->m_start).m_first = piVar4;
  (this->m_start).m_last = piVar4 + 0x40;
  (this->m_start).m_cur = piVar4;
  (this->m_finish).m_node = ppiVar3;
  piVar4 = *ppiVar3;
  (this->m_finish).m_first = piVar4;
  (this->m_finish).m_last = piVar4 + 0x40;
  (this->m_finish).m_cur = piVar4;
  return;
}

Assistant:

void dequeInit(size_type n) {
		chunk_allocator	chunk_alloc;

		this->m_chunks = (n / this->chunk_size()) + 1;
		this->m_map_size = ft::max<size_type>(8, this->m_chunks + 2);
		this->m_map = chunk_alloc.allocate(this->m_map_size);

		map_pointer	tmp_start = this->m_map + ((this->m_map_size - this->m_chunks) / 2);
		map_pointer	tmp_finish = tmp_start + this->m_chunks - 1;

		for (size_type i = 0; i < this->m_map_size; ++i) {
			pointer p = NULL;
			if (this->m_map + i >= tmp_start && this->m_map + i <= tmp_finish)
				p = this->m_alloc.allocate(this->chunk_size());
			chunk_alloc.construct(this->m_map + i, p);
		}

		this->m_start.setNode(this->m_map + ((this->m_map_size - 1) / 2));
		this->m_start.m_cur = this->m_start.m_first;
		this->m_finish.setNode(this->m_map + ((this->m_map_size - 1) / 2));
		this->m_finish.m_cur = this->m_finish.m_first;
	}